

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_titlecase_brkiter.cpp
# Opt level: O3

int32_t icu_63::CaseMap::toTitle
                  (char *locale,uint32_t options,BreakIterator *iter,UChar *src,int32_t srcLength,
                  UChar *dest,int32_t destCapacity,Edits *edits,UErrorCode *errorCode)

{
  int32_t iVar1;
  BreakIterator *iter_00;
  ConstChar16Ptr local_98;
  LocalPointer<icu_63::BreakIterator> ownedIter;
  UnicodeString s;
  
  ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr =
       (LocalPointerBase<icu_63::BreakIterator>)(BreakIterator *)0x0;
  iVar1 = 0;
  iter_00 = ustrcase_getTitleBreakIterator_63
                      ((Locale *)0x0,locale,options,iter,&ownedIter,errorCode);
  if (iter_00 != (BreakIterator *)0x0) {
    local_98.p_ = src;
    UnicodeString::UnicodeString(&s,(byte)((uint)srcLength >> 0x1f),&local_98,srcLength);
    (*(iter_00->super_UObject)._vptr_UObject[7])(iter_00,&s);
    iVar1 = ustrcase_getCaseLocale_63(locale);
    iVar1 = ustrcase_map_63(iVar1,options,iter_00,dest,destCapacity,src,srcLength,
                            ustrcase_internalToTitle_63,edits,errorCode);
    UnicodeString::~UnicodeString(&s);
  }
  if (ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr != (BreakIterator *)0x0) {
    (**(code **)(*(long *)ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr + 8))();
  }
  return iVar1;
}

Assistant:

int32_t CaseMap::toTitle(
        const char *locale, uint32_t options, BreakIterator *iter,
        const UChar *src, int32_t srcLength,
        UChar *dest, int32_t destCapacity, Edits *edits,
        UErrorCode &errorCode) {
    LocalPointer<BreakIterator> ownedIter;
    iter = ustrcase_getTitleBreakIterator(nullptr, locale, options, iter, ownedIter, errorCode);
    if(iter==NULL) {
        return 0;
    }
    UnicodeString s(srcLength<0, src, srcLength);
    iter->setText(s);
    return ustrcase_map(
        ustrcase_getCaseLocale(locale), options, iter,
        dest, destCapacity,
        src, srcLength,
        ustrcase_internalToTitle, edits, errorCode);
}